

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sturm.cpp
# Opt level: O0

void __thiscall
opengv::math::Sturm::findRoots2
          (Sturm *this,vector<double,_std::allocator<double>_> *roots,double eps_x,double eps_val)

{
  bool bVar1;
  undefined1 uVar2;
  Bracket *pBVar3;
  element_type *peVar4;
  element_type *peVar5;
  size_t sVar6;
  Sturm *this_00;
  Scalar *pSVar7;
  Bracket *in_RSI;
  long in_RDI;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double in_XMM1_Qa;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  size_t changes;
  iterator it;
  double newValue;
  size_t i_1;
  double newRoot;
  double derivative;
  MatrixXd matDerivative;
  double value;
  MatrixXd matValue;
  size_t i;
  double root;
  bool converged;
  bool divide;
  Ptr bracket;
  MatrixXd monomials;
  list<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
  stack;
  double absoluteBound;
  Bracket *in_stack_fffffffffffffc58;
  DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *in_stack_fffffffffffffc60;
  Bracket *in_stack_fffffffffffffc68;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_fffffffffffffc70;
  unsigned_long *in_stack_fffffffffffffc78;
  Matrix<double,__1,__1,_0,__1,__1> *in_stack_fffffffffffffc80;
  size_type in_stack_fffffffffffffc88;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffc90;
  list<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
  *in_stack_fffffffffffffca8;
  Bracket *in_stack_fffffffffffffcb0;
  Sturm *in_stack_fffffffffffffd00;
  undefined7 in_stack_fffffffffffffd08;
  undefined1 in_stack_fffffffffffffd0f;
  Sturm *in_stack_fffffffffffffd10;
  _List_iterator<std::shared_ptr<opengv::math::Bracket>_> local_278;
  Scalar local_270;
  ulong local_1f0;
  int local_1e4;
  Bracket *local_1e0;
  double local_1d8;
  Scalar local_140;
  ulong local_a8;
  Bracket *local_a0;
  byte local_92;
  byte local_91;
  DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> local_90 [20];
  undefined4 local_7c;
  list<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
  local_40;
  double local_28;
  double local_20;
  Bracket *local_10;
  
  local_20 = in_XMM1_Qa;
  local_10 = in_RSI;
  local_28 = computeLagrangianBound(in_stack_fffffffffffffd00);
  std::__cxx11::
  list<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
  ::list((list<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
          *)0x127c8b4);
  pBVar3 = (Bracket *)operator_new(0x30);
  Bracket::Bracket(pBVar3,-local_28,local_28);
  std::shared_ptr<opengv::math::Bracket>::shared_ptr<opengv::math::Bracket,void>
            ((shared_ptr<opengv::math::Bracket> *)in_stack_fffffffffffffc60,
             in_stack_fffffffffffffc58);
  std::__cxx11::
  list<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
  ::push_back((list<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
               *)in_stack_fffffffffffffc70,(value_type *)in_stack_fffffffffffffc68);
  std::shared_ptr<opengv::math::Bracket>::~shared_ptr
            ((shared_ptr<opengv::math::Bracket> *)0x127c92c);
  std::__cxx11::
  list<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
  ::back((list<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
          *)in_stack_fffffffffffffc60);
  peVar4 = std::__shared_ptr_access<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x127c949);
  std::__cxx11::
  list<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
  ::back((list<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
          *)in_stack_fffffffffffffc60);
  peVar5 = std::__shared_ptr_access<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x127c966);
  Bracket::lowerBound(peVar5);
  sVar6 = evaluateChain2(in_stack_fffffffffffffd10,
                         (double)CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08));
  Bracket::setLowerBoundChanges(peVar4,sVar6);
  std::__cxx11::
  list<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
  ::back((list<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
          *)in_stack_fffffffffffffc60);
  peVar4 = std::__shared_ptr_access<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x127c9b7);
  std::__cxx11::
  list<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
  ::back((list<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
          *)in_stack_fffffffffffffc60);
  peVar5 = std::__shared_ptr_access<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x127c9d4);
  Bracket::upperBound(peVar5);
  sVar6 = evaluateChain2(in_stack_fffffffffffffd10,
                         (double)CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08));
  Bracket::setUpperBoundChanges(peVar4,sVar6);
  std::__cxx11::
  list<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
  ::back((list<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
          *)in_stack_fffffffffffffc60);
  std::__shared_ptr_access<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
             )0x127ca2d);
  Bracket::numberRoots(in_stack_fffffffffffffc58);
  std::vector<double,_std::allocator<double>_>::reserve
            (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
  local_7c = 1;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<unsigned_long,int>
            (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,(int *)in_stack_fffffffffffffc70);
  this_00 = (Sturm *)Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                               (in_stack_fffffffffffffc60,(Index)in_stack_fffffffffffffc58,0x127caa4
                               );
  this_00->_vptr_Sturm = (_func_int **)0x3ff0000000000000;
  do {
    bVar1 = std::__cxx11::
            list<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
            ::empty(&local_40);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                ((Matrix<double,__1,__1,_0,__1,__1> *)0x127d368);
      std::__cxx11::
      list<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
      ::~list((list<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
               *)0x127d375);
      return;
    }
    std::__cxx11::
    list<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
    ::front((list<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
             *)in_stack_fffffffffffffc60);
    std::shared_ptr<opengv::math::Bracket>::shared_ptr
              ((shared_ptr<opengv::math::Bracket> *)in_stack_fffffffffffffc60,
               (shared_ptr<opengv::math::Bracket> *)in_stack_fffffffffffffc58);
    std::__cxx11::
    list<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
    ::pop_front((list<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
                 *)in_stack_fffffffffffffc60);
    std::__shared_ptr_access<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x127cb21);
    uVar2 = Bracket::dividable(in_stack_fffffffffffffc68,(double)in_stack_fffffffffffffc60);
    if ((bool)uVar2) {
      local_91 = 1;
      std::__shared_ptr_access<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x127cb60);
      sVar6 = Bracket::numberRoots(in_stack_fffffffffffffc58);
      if (sVar6 == 1) {
        local_92 = 0;
        peVar4 = std::
                 __shared_ptr_access<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x127cb99);
        dVar8 = Bracket::lowerBound(peVar4);
        peVar4 = std::
                 __shared_ptr_access<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x127cbb7);
        dVar9 = Bracket::upperBound(peVar4);
        local_a0 = (Bracket *)((dVar8 + dVar9) * 0.5);
        for (local_a8 = 2; local_a8 <= *(ulong *)(in_RDI + 0x20); local_a8 = local_a8 + 1) {
          pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                             (in_stack_fffffffffffffc60,(Index)in_stack_fffffffffffffc58,0x127cc36);
          dVar8 = *pSVar7 * (double)local_a0;
          pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                             (in_stack_fffffffffffffc60,(Index)in_stack_fffffffffffffc58,0x127cc87);
          *pSVar7 = dVar8;
        }
        Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
                  (in_stack_fffffffffffffc70,(Index)in_stack_fffffffffffffc68);
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,1,-1,false>>::operator*
                  ((MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
                    *)in_stack_fffffffffffffc70,
                   (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                   in_stack_fffffffffffffc68);
        Eigen::Matrix<double,-1,-1,0,-1,-1>::
        Matrix<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
                  ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffc60,
                   (EigenBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
                    *)in_stack_fffffffffffffc58);
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                           (in_stack_fffffffffffffc60,(Index)in_stack_fffffffffffffc58,0x127cdbc);
        local_140 = *pSVar7;
        do {
          if (((local_92 ^ 0xff) & 1) == 0) break;
          Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
                    (in_stack_fffffffffffffc70,(Index)in_stack_fffffffffffffc68);
          Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,1,-1,false>>::operator*
                    ((MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
                      *)in_stack_fffffffffffffc70,
                     (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                     in_stack_fffffffffffffc68);
          Eigen::Matrix<double,-1,-1,0,-1,-1>::
          Matrix<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
                    ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffc60,
                     (EigenBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
                      *)in_stack_fffffffffffffc58);
          pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                             (in_stack_fffffffffffffc60,(Index)in_stack_fffffffffffffc58,0x127ce51);
          local_1d8 = *pSVar7;
          pBVar3 = (Bracket *)((double)local_a0 - local_140 / local_1d8);
          local_1e0 = pBVar3;
          peVar4 = std::
                   __shared_ptr_access<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x127ceae);
          dVar8 = Bracket::lowerBound(peVar4);
          if ((double)pBVar3 < dVar8) {
LAB_0127cef6:
            local_1e4 = 8;
          }
          else {
            in_stack_fffffffffffffcb0 = local_1e0;
            peVar4 = std::
                     __shared_ptr_access<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x127cede);
            dVar8 = Bracket::upperBound(peVar4);
            if (dVar8 < (double)in_stack_fffffffffffffcb0) goto LAB_0127cef6;
            for (local_1f0 = 2; local_1f0 <= *(ulong *)(in_RDI + 0x20); local_1f0 = local_1f0 + 1) {
              in_stack_fffffffffffffca8 =
                   (list<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
                    *)Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::
                      operator()(in_stack_fffffffffffffc60,(Index)in_stack_fffffffffffffc58,
                                 0x127cf96);
              dVar8 = (double)(in_stack_fffffffffffffca8->
                              super__List_base<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
                              )._M_impl._M_node.super__List_node_base._M_next * (double)local_1e0;
              pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::
                       operator()(in_stack_fffffffffffffc60,(Index)in_stack_fffffffffffffc58,
                                  0x127cfe1);
              *pSVar7 = dVar8;
            }
            Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
                      (in_stack_fffffffffffffc70,(Index)in_stack_fffffffffffffc68);
            Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,1,-1,false>>::
            operator*((MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
                       *)in_stack_fffffffffffffc70,
                      (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                      in_stack_fffffffffffffc68);
            Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
                      ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffc60,
                       (DenseBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
                        *)in_stack_fffffffffffffc58);
            pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                               (in_stack_fffffffffffffc60,(Index)in_stack_fffffffffffffc58,0x127d079
                               );
            local_270 = *pSVar7;
            auVar10._8_8_ = 0;
            auVar10._0_8_ = local_270;
            auVar12._8_8_ = 0x7fffffffffffffff;
            auVar12._0_8_ = 0x7fffffffffffffff;
            auVar10 = vpand_avx(auVar10,auVar12);
            auVar13._8_8_ = 0;
            auVar13._0_8_ = local_140;
            auVar15._8_8_ = 0x7fffffffffffffff;
            auVar15._0_8_ = 0x7fffffffffffffff;
            auVar12 = vpand_avx(auVar13,auVar15);
            if (auVar10._0_8_ <= auVar12._0_8_) {
              local_a0 = local_1e0;
              auVar11._8_8_ = 0;
              auVar11._0_8_ = local_270;
              auVar14._8_8_ = 0x7fffffffffffffff;
              auVar14._0_8_ = 0x7fffffffffffffff;
              auVar10 = vpand_avx(auVar11,auVar14);
              if (auVar10._0_8_ < local_20) {
                local_92 = 1;
              }
              local_1e4 = 0;
              local_140 = local_270;
            }
            else {
              local_1e4 = 8;
            }
          }
          Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                    ((Matrix<double,__1,__1,_0,__1,__1> *)0x127d13a);
        } while (local_1e4 == 0);
        if ((local_92 & 1) != 0) {
          local_91 = 0;
          std::vector<double,_std::allocator<double>_>::push_back
                    ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffc70,
                     (value_type_conflict1 *)in_stack_fffffffffffffc68);
        }
        Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                  ((Matrix<double,__1,__1,_0,__1,__1> *)0x127d186);
      }
      if ((local_91 & 1) != 0) {
        std::__shared_ptr_access<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x127d1b5);
        Bracket::divide(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
        local_278._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
             ::end((list<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
                    *)in_stack_fffffffffffffc58);
        std::_List_iterator<std::shared_ptr<opengv::math::Bracket>_>::operator--(&local_278,0);
        std::_List_iterator<std::shared_ptr<opengv::math::Bracket>_>::operator*
                  ((_List_iterator<std::shared_ptr<opengv::math::Bracket>_> *)0x127d202);
        peVar4 = std::
                 __shared_ptr_access<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x127d20a);
        Bracket::lowerBound(peVar4);
        sVar6 = evaluateChain2(this_00,(double)CONCAT17(uVar2,in_stack_fffffffffffffd08));
        std::_List_iterator<std::shared_ptr<opengv::math::Bracket>_>::operator*
                  ((_List_iterator<std::shared_ptr<opengv::math::Bracket>_> *)0x127d240);
        peVar4 = std::
                 __shared_ptr_access<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x127d248);
        Bracket::setLowerBoundChanges(peVar4,sVar6);
        std::_List_iterator<std::shared_ptr<opengv::math::Bracket>_>::operator--(&local_278,0);
        std::_List_iterator<std::shared_ptr<opengv::math::Bracket>_>::operator*
                  ((_List_iterator<std::shared_ptr<opengv::math::Bracket>_> *)0x127d27c);
        peVar4 = std::
                 __shared_ptr_access<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x127d284);
        Bracket::setUpperBoundChanges(peVar4,sVar6);
      }
    }
    else {
      std::__shared_ptr_access<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x127d2a6);
      sVar6 = Bracket::numberRoots(in_stack_fffffffffffffc58);
      if (sVar6 != 0) {
        in_stack_fffffffffffffc60 = local_90;
        in_stack_fffffffffffffc68 = local_10;
        peVar4 = std::
                 __shared_ptr_access<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x127d2df);
        in_stack_fffffffffffffc70 =
             (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)Bracket::lowerBound(peVar4);
        peVar4 = std::
                 __shared_ptr_access<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<opengv::math::Bracket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x127d2f7);
        Bracket::upperBound(peVar4);
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffc60,
                   (value_type_conflict1 *)in_stack_fffffffffffffc58);
      }
    }
    std::shared_ptr<opengv::math::Bracket>::~shared_ptr
              ((shared_ptr<opengv::math::Bracket> *)0x127d347);
  } while( true );
}

Assistant:

void
opengv::math::Sturm::findRoots2( std::vector<double> & roots, double eps_x, double eps_val )
{
  double absoluteBound = computeLagrangianBound();
  std::list<Bracket::Ptr> stack;
  stack.push_back(Bracket::Ptr(new Bracket(-absoluteBound,absoluteBound)));
  stack.back()->setLowerBoundChanges( evaluateChain2(stack.back()->lowerBound()) );
  stack.back()->setUpperBoundChanges( evaluateChain2(stack.back()->upperBound()) );
  roots.reserve(stack.back()->numberRoots());
  
  //some variables for pollishing
  Eigen::MatrixXd monomials(_dimension,1);
  monomials(_dimension-1,0) = 1.0;
  
  while( !stack.empty() )
  {  
    Bracket::Ptr bracket = stack.front();
    stack.pop_front();
    
    if( bracket->dividable(eps_x) )
    {
      bool divide = true;
      
      if( bracket->numberRoots() == 1 )
      {
        //new part, we try immediately to do the pollishing here
        bool converged = false;
        
        double root = 0.5 * (bracket->lowerBound() + bracket->upperBound());
        for(size_t i = 2; i <= _dimension; i++)
          monomials(_dimension-i,0) = monomials(_dimension-i+1,0)*root;
        Eigen::MatrixXd matValue = _C.row(0) * monomials;
        
        double value = matValue(0,0);
        
        while( !converged )
        {
          Eigen::MatrixXd matDerivative = _C.row(1) * monomials;
          double derivative = matDerivative(0,0);
          
          double newRoot = root - (value/derivative);
          
          if( newRoot < bracket->lowerBound() || newRoot > bracket->upperBound() )
            break;
          
          for(size_t i = 2; i <= _dimension; i++)
            monomials(_dimension-i,0) = monomials(_dimension-i+1,0)*newRoot;
          matValue = _C.row(0) * monomials;
          
          double newValue = matValue(0,0);
          
          if( fabs(newValue) > fabs(value) )
            break;
          
          //do update
          value = newValue;
          root = newRoot;
          
          //check if converged
          if( fabs(value) < eps_val )
            converged = true;
        }
        
        if( converged )
        {
          divide = false;
          roots.push_back(root);
        }
      }
      
      if(divide)
      {
        bracket->divide(stack);
        std::list<Bracket::Ptr>::iterator it = stack.end();
        it--;
        size_t changes = evaluateChain2((*it)->lowerBound());
        (*it)->setLowerBoundChanges(changes);
        it--;
        (*it)->setUpperBoundChanges(changes);
      }
    }
    else
    {
      if( bracket->numberRoots() > 0 )
        roots.push_back(0.5 * (bracket->lowerBound() + bracket->upperBound()));
    }
  }
}